

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer2.c
# Opt level: O3

ktx_error_code_e
ktxTexture2_WriteToMemory(ktxTexture2 *This,ktx_uint8_t **ppDstBytes,ktx_size_t *pSize)

{
  ktx_error_code_e kVar1;
  ktx_size_t strSize;
  ktxStream dststr;
  int local_90 [2];
  ktxStream local_88;
  
  kVar1 = KTX_INVALID_VALUE;
  if (pSize != (ktx_size_t *)0x0 &&
      (ppDstBytes != (ktx_uint8_t **)0x0 && This != (ktxTexture2 *)0x0)) {
    *ppDstBytes = (ktx_uint8_t *)0x0;
    kVar1 = ktxMemStream_construct(&local_88,false);
    if (kVar1 == KTX_SUCCESS) {
      kVar1 = ktxTexture2_WriteToStream(This,&local_88);
      if (kVar1 == KTX_SUCCESS) {
        ktxMemStream_getdata(&local_88,ppDstBytes);
        (*local_88.getsize)(&local_88,(ktx_size_t *)local_90);
        *pSize = (long)local_90[0];
        kVar1 = KTX_SUCCESS;
      }
      ktxMemStream_destruct(&local_88);
    }
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture2_WriteToMemory(ktxTexture2* This,
                          ktx_uint8_t** ppDstBytes, ktx_size_t* pSize)
{
    struct ktxStream dststr;
    KTX_error_code result;
    ktx_size_t strSize;

    if (!This || !ppDstBytes || !pSize)
        return KTX_INVALID_VALUE;

    *ppDstBytes = NULL;

    result = ktxMemStream_construct(&dststr, KTX_FALSE);
    if (result != KTX_SUCCESS)
        return result;

    result = ktxTexture2_WriteToStream(This, &dststr);
    if(result != KTX_SUCCESS)
    {
        ktxMemStream_destruct(&dststr);
        return result;
    }

    ktxMemStream_getdata(&dststr, ppDstBytes);
    dststr.getsize(&dststr, &strSize);
    *pSize = (GLsizei)strSize;
    /* This function does not free the memory pointed at by the
     * value obtained from ktxMemStream_getdata() thanks to the
     * KTX_FALSE passed to the constructor above.
     */
    ktxMemStream_destruct(&dststr);
    return KTX_SUCCESS;

}